

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void duckdb::TemplatedWritePlain<short,int,duckdb::ParquetCastOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  unsigned_long *puVar1;
  int iVar2;
  long lVar3;
  NumericStatisticsState<short,_int,_duckdb::BaseParquetOperator> *numeric_stats;
  int local_write [2048];
  int local_2038 [2050];
  
  if (chunk_start < chunk_end) {
    lVar3 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) ||
         ((puVar1[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
        iVar2 = (int)*(short *)(&col->vector_type + chunk_start * 2);
        if (iVar2 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
          *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar2;
        }
        if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar2) {
          *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar2;
        }
        local_2038[lVar3] = iVar2;
        lVar3 = lVar3 + 1;
        if (lVar3 == 0x800) {
          (**ser->_vptr_WriteStream)(ser,local_2038,0x2000);
          lVar3 = 0;
        }
      }
      chunk_start = chunk_start + 1;
    } while (chunk_end != chunk_start);
    lVar3 = lVar3 << 2;
  }
  else {
    lVar3 = 0;
  }
  (**ser->_vptr_WriteStream)(ser,local_2038,lVar3);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}